

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

void __thiscall FNodeBuilder::GroupSegPlanes(FNodeBuilder *this)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FPrivSeg *pFVar6;
  FPrivVert *pFVar7;
  FSimpleLine *pFVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  FPrivSeg *pFVar12;
  int iVar13;
  long lVar14;
  uint amount;
  double dVar16;
  double d_x;
  double d_y;
  double dVar17;
  double d_dy;
  double dVar18;
  double d_dx;
  double dVar19;
  double l;
  double dVar20;
  double dVar21;
  FPrivSeg *buckets [4096];
  long local_8038 [4097];
  int iVar15;
  
  amount = 0;
  memset(local_8038,0,0x8000);
  uVar10 = (this->Segs).Count;
  if (0 < (long)(int)uVar10) {
    pFVar6 = (this->Segs).Array;
    iVar13 = 1;
    lVar14 = 0;
    do {
      *(int *)((long)&pFVar6->next + lVar14) = iVar13;
      *(undefined8 *)((long)&pFVar6->hashnext + lVar14) = 0;
      lVar14 = lVar14 + 0x48;
      iVar13 = iVar13 + 1;
    } while ((long)(int)uVar10 * 0x48 != lVar14);
  }
  (this->Segs).Array[uVar10 - 1].next = 0xffffffff;
  if (0 < (int)(this->Segs).Count) {
    lVar14 = 0;
    iVar13 = 0;
    do {
      pFVar7 = (this->Vertices).Array;
      pFVar6 = (this->Segs).Array + lVar14;
      iVar15 = pFVar7[pFVar6->v1].super_FSimpleVert.x;
      iVar2 = pFVar7[pFVar6->v1].super_FSimpleVert.y;
      iVar3 = pFVar7[pFVar6->v2].super_FSimpleVert.x;
      iVar4 = pFVar7[pFVar6->v2].super_FSimpleVert.y;
      dVar16 = c_atan2((double)(iVar4 - iVar2),(double)(iVar3 - iVar15));
      uVar10 = (uint)(int)(dVar16 * 341782637.7882158) >> 0x12 & 0xfff;
      pFVar7 = (this->Vertices).Array;
      pFVar12 = (FPrivSeg *)local_8038[uVar10];
      do {
        if (pFVar12 == (FPrivSeg *)0x0) {
          pFVar12 = (FPrivSeg *)0x0;
          break;
        }
        iVar5 = pFVar7[pFVar12->v1].super_FSimpleVert.x;
        iVar11 = pFVar7[pFVar12->v1].super_FSimpleVert.y;
        dVar19 = (double)(pFVar7[pFVar12->v2].super_FSimpleVert.x - iVar5);
        dVar18 = (double)(pFVar7[pFVar12->v2].super_FSimpleVert.y - iVar11);
        dVar17 = (double)iVar5;
        dVar16 = (double)iVar11;
        dVar21 = (dVar16 - (double)iVar2) * dVar19 - (dVar17 - (double)iVar15) * dVar18;
        if ((((17179869184.0 <= ABS(dVar21)) ||
             (dVar20 = dVar18 * dVar18 + dVar19 * dVar19, 42.94967296 <= (dVar21 * dVar21) / dVar20)
             ) || (dVar16 = (dVar16 - (double)iVar4) * dVar19 - (dVar17 - (double)iVar3) * dVar18,
                  17179869184.0 <= ABS(dVar16))) || (42.94967296 <= (dVar16 * dVar16) / dVar20)) {
          pFVar12 = pFVar12->hashnext;
          bVar9 = true;
        }
        else {
          bVar9 = false;
        }
      } while (bVar9);
      if (pFVar12 == (FPrivSeg *)0x0) {
        pFVar6->hashnext = (FPrivSeg *)local_8038[uVar10];
        local_8038[uVar10] = (long)pFVar6;
        pFVar6->planenum = iVar13;
        iVar13 = iVar13 + 1;
        pFVar6->planefront = true;
        pFVar7 = (this->Vertices).Array;
        iVar15 = pFVar7[pFVar6->v1].super_FSimpleVert.x;
        iVar2 = pFVar7[pFVar6->v1].super_FSimpleVert.y;
        iVar3 = pFVar7[pFVar6->v2].super_FSimpleVert.x;
        iVar4 = pFVar7[pFVar6->v2].super_FSimpleVert.y;
        TArray<FNodeBuilder::FSimpleLine,_FNodeBuilder::FSimpleLine>::Grow(&this->Planes,1);
        pFVar8 = (this->Planes).Array;
        uVar10 = (this->Planes).Count;
        pFVar8[uVar10].x = iVar15;
        pFVar8[uVar10].y = iVar2;
        pFVar8[uVar10].dx = iVar3 - iVar15;
        pFVar8[uVar10].dy = iVar4 - iVar2;
        puVar1 = &(this->Planes).Count;
        *puVar1 = *puVar1 + 1;
      }
      else {
        iVar5 = pFVar12->planenum;
        pFVar6->planenum = iVar5;
        pFVar8 = (this->Planes).Array;
        iVar11 = pFVar8[iVar5].dx;
        if (iVar11 == 0) {
          iVar11 = pFVar8[iVar5].dy;
          if ((iVar4 <= iVar2) || (iVar11 < 1)) {
            if (iVar4 < iVar2) goto LAB_003a9676;
            goto LAB_003a9681;
          }
        }
        else if ((iVar3 <= iVar15) || (iVar11 < 1)) {
          if (iVar3 < iVar15) {
LAB_003a9676:
            if (iVar11 < 0) goto LAB_003a967a;
          }
LAB_003a9681:
          pFVar6->planefront = false;
          goto LAB_003a9686;
        }
LAB_003a967a:
        pFVar6->planefront = true;
      }
LAB_003a9686:
      lVar14 = lVar14 + 1;
    } while (lVar14 < (int)(this->Segs).Count);
    iVar15 = iVar13 + 0xe;
    if (-1 < iVar13 + 7) {
      iVar15 = iVar13 + 7;
    }
    amount = iVar15 >> 3;
  }
  TArray<unsigned_char,_unsigned_char>::Grow(&this->PlaneChecked,amount);
  puVar1 = &(this->PlaneChecked).Count;
  *puVar1 = *puVar1 + amount;
  return;
}

Assistant:

void FNodeBuilder::GroupSegPlanes ()
{
	const int bucketbits = 12;
	FPrivSeg *buckets[1<<bucketbits] = { 0 };
	int i, planenum;

	for (i = 0; i < (int)Segs.Size(); ++i)
	{
		FPrivSeg *seg = &Segs[i];
		seg->next = i+1;
		seg->hashnext = NULL;
	}

	Segs[Segs.Size()-1].next = DWORD_MAX;

	for (i = planenum = 0; i < (int)Segs.Size(); ++i)
	{
		FPrivSeg *seg = &Segs[i];
		fixed_t x1 = Vertices[seg->v1].x;
		fixed_t y1 = Vertices[seg->v1].y;
		fixed_t x2 = Vertices[seg->v2].x;
		fixed_t y2 = Vertices[seg->v2].y;
		angle_t ang = PointToAngle (x2 - x1, y2 - y1);

		if (ang >= 1u<<31)
			ang += 1u<<31;

		FPrivSeg *check = buckets[ang >>= 31-bucketbits];

		while (check != NULL)
		{
			fixed_t cx1 = Vertices[check->v1].x;
			fixed_t cy1 = Vertices[check->v1].y;
			fixed_t cdx = Vertices[check->v2].x - cx1;
			fixed_t cdy = Vertices[check->v2].y - cy1;
			if (PointOnSide (x1, y1, cx1, cy1, cdx, cdy) == 0 &&
				PointOnSide (x2, y2, cx1, cy1, cdx, cdy) == 0)
			{
				break;
			}
			check = check->hashnext;
		}
		if (check != NULL)
		{
			seg->planenum = check->planenum;
			const FSimpleLine *line = &Planes[seg->planenum];
			if (line->dx != 0)
			{
				if ((line->dx > 0 && x2 > x1) || (line->dx < 0 && x2 < x1))
				{
					seg->planefront = true;
				}
				else
				{
					seg->planefront = false;
				}
			}
			else
			{
				if ((line->dy > 0 && y2 > y1) || (line->dy < 0 && y2 < y1))
				{
					seg->planefront = true;
				}
				else
				{
					seg->planefront = false;
				}
			}
		}
		else
		{
			seg->hashnext = buckets[ang];
			buckets[ang] = seg;
			seg->planenum = planenum++;
			seg->planefront = true;

			FSimpleLine pline = { Vertices[seg->v1].x,
								  Vertices[seg->v1].y,
								  Vertices[seg->v2].x - Vertices[seg->v1].x,
								  Vertices[seg->v2].y - Vertices[seg->v1].y };
			Planes.Push (pline);
		}
	}

	D(Printf ("%d planes from %d segs\n", planenum, Segs.Size()));

	PlaneChecked.Reserve ((planenum + 7) / 8);
}